

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O1

HFFilteredConsumer * __thiscall
MlmWrap::createFilteredConsumer
          (MlmWrap *this,HighFreqDataType *dt,size_t buffersize,hfs_data_filter_fn *filter,
          HFParsingInfo *parser)

{
  SubType SVar1;
  HFFilteredConsumer *this_00;
  HFParsingInfo local_2e0;
  HighFreqDataType local_2a0;
  HFSubSockSettings local_210;
  HighFreqDataType local_168;
  SubType local_d8;
  undefined4 uStack_d4;
  hfs_data_callback_fn p_Stack_d0;
  void *pvStack_c8;
  HighFreqDataType local_c0;
  
  this_00 = (HFFilteredConsumer *)operator_new(0x420);
  HighFreqDataType::HighFreqDataType(&local_2a0,dt);
  std::vector<int,_std::allocator<int>_>::vector(&local_2e0.indices,&parser->indices);
  local_2e0.sizeOf = parser->sizeOf;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&local_2e0.dataRequested,&parser->dataRequested);
  local_2e0.dataLength = parser->dataLength;
  HFFilteredConsumer::HFFilteredConsumer(this_00,&local_2a0,(int)buffersize,filter,&local_2e0);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_2e0.dataRequested);
  if (local_2e0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2e0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_2e0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_2e0.indices.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  HighFreqDataType::~HighFreqDataType(&local_2a0);
  addSubToList(this,(HighFreqSub *)this_00);
  HighFreqDataType::HighFreqDataType(&local_c0,dt);
  SVar1 = (this_00->super_HFSubConsumer).super_HighFreqSub.sockType;
  HighFreqDataType::HighFreqDataType(&local_168,&local_c0);
  p_Stack_d0 = (hfs_data_callback_fn)0x0;
  pvStack_c8 = (void *)0x0;
  local_d8 = SVar1;
  HighFreqDataType::~HighFreqDataType(&local_c0);
  HighFreqDataType::HighFreqDataType(&local_210.dataType,&local_168);
  local_210.args = pvStack_c8;
  local_210._148_4_ = uStack_d4;
  local_210.subSockType = local_d8;
  local_210.userFoo = p_Stack_d0;
  addHfTypeToSubbedList(this,&local_210);
  HighFreqDataType::~HighFreqDataType(&local_210.dataType);
  HighFreqDataType::~HighFreqDataType(&local_168);
  return this_00;
}

Assistant:

HFFilteredConsumer* MlmWrap::createFilteredConsumer(HighFreqDataType dt, size_t buffersize, hfs_data_filter_fn* filter, HFParsingInfo parser){
    HFFilteredConsumer *newsub = new HFFilteredConsumer(dt, buffersize, filter, parser);
    addSubToList(newsub);
    HFSubSockSettings sockInfo(dt, newsub->getSubSockType(), NULL, NULL);
    addHfTypeToSubbedList(sockInfo);
    return newsub;
}